

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O0

void __thiscall
aeron::archive::RecordingDescriptorPoller::RecordingDescriptorPoller
          (RecordingDescriptorPoller *this,shared_ptr<aeron::Subscription> *subscription,
          int32_t fragmentLimit,int64_t controlSessionId)

{
  anon_class_8_1_8991fb9c local_50;
  controlled_poll_fragment_handler_t local_48;
  int64_t local_28;
  int64_t controlSessionId_local;
  shared_ptr<aeron::Subscription> *psStack_18;
  int32_t fragmentLimit_local;
  shared_ptr<aeron::Subscription> *subscription_local;
  RecordingDescriptorPoller *this_local;
  
  local_28 = controlSessionId;
  controlSessionId_local._4_4_ = fragmentLimit;
  psStack_18 = subscription;
  subscription_local = &this->subscription_;
  std::shared_ptr<aeron::Subscription>::shared_ptr(&this->subscription_,subscription);
  this->fragmentLimit_ = controlSessionId_local._4_4_;
  this->controlSessionId_ = local_28;
  local_50.this = this;
  std::
  function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>
  ::
  function<aeron::archive::RecordingDescriptorPoller::RecordingDescriptorPoller(std::shared_ptr<aeron::Subscription>const&,int,long)::__0,void>
            ((function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>
              *)&local_48,&local_50);
  ControlledFragmentAssembler::ControlledFragmentAssembler
            (&this->fragmentAssembler_,&local_48,0x1000);
  std::
  function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  ::~function(&local_48);
  std::
  function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->consumer_);
  this->isDispatchComplete_ = false;
  return;
}

Assistant:

RecordingDescriptorPoller::RecordingDescriptorPoller(const std::shared_ptr<Subscription>& subscription,
                                                     std::int32_t fragmentLimit, std::int64_t controlSessionId)
    : subscription_(subscription)
    , fragmentLimit_(fragmentLimit)
    , controlSessionId_(controlSessionId)
    , fragmentAssembler_([this](concurrent::AtomicBuffer& buffer, util::index_t offset, util::index_t length,
                                Header& header) { return onFragment(buffer, offset, length, header); }) {}